

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::insertParagraphSeparator(QWidgetTextControlPrivate *this)

{
  char cVar1;
  bool bVar2;
  MarkerType MVar3;
  long lVar4;
  QTextCursor *pQVar5;
  long in_FS_OFFSET;
  QTextFormat aQStack_a8 [16];
  QTextFormat local_98 [32];
  QArrayDataPointer<char16_t> local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &this->cursor;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  QTextFormat::clearProperty((int)local_48);
  cVar1 = QTextFormat::hasProperty((int)local_48);
  if (cVar1 != '\0') {
    QTextFormat::clearProperty((int)local_48);
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_78);
    QTextFormat::operator=((QTextFormat *)&local_58,(QTextFormat *)&local_78);
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
  }
  lVar4 = QTextCursor::currentList();
  if (lVar4 != 0) {
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat();
    QTextFormat::clearProperty((int)&local_78);
    QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar5);
    MVar3 = QTextBlockFormat::marker((QTextBlockFormat *)local_48);
    if (MVar3 == Checked) {
      QTextBlockFormat::setMarker((QTextBlockFormat *)local_48,Unchecked);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
  }
  QTextCursor::block();
  QTextBlock::text();
  if (local_78.size == 0) {
    QTextCursor::blockFormat();
    cVar1 = QTextFormat::hasProperty((int)local_98);
    if (cVar1 != '\0') {
      QTextFormat::~QTextFormat(local_98);
      goto LAB_0048017e;
    }
    QTextCursor::blockFormat();
    cVar1 = QTextFormat::hasProperty((int)aQStack_a8);
    QTextFormat::~QTextFormat(aQStack_a8);
    QTextFormat::~QTextFormat(local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    if (cVar1 == '\0') {
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_78);
      QTextFormat::operator=((QTextFormat *)local_48,(QTextFormat *)&local_78);
      QTextFormat::~QTextFormat((QTextFormat *)&local_78);
      QTextCursor::blockFormat();
      bVar2 = QTextFormat::operator!=((QTextFormat *)&local_78,(QTextFormat *)local_48);
      QTextFormat::~QTextFormat((QTextFormat *)&local_78);
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_78);
      QTextFormat::operator=((QTextFormat *)&local_58,(QTextFormat *)&local_78);
      QTextFormat::~QTextFormat((QTextFormat *)&local_78);
      QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar5);
      QTextCursor::setCharFormat((QTextCharFormat *)pQVar5);
      if (bVar2) goto LAB_0048019a;
    }
  }
  else {
LAB_0048017e:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QTextCursor::insertBlock((QTextBlockFormat *)pQVar5,(QTextCharFormat *)local_48);
LAB_0048019a:
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::insertParagraphSeparator()
{
    // clear blockFormat properties that the user is unlikely to want duplicated:
    // - don't insert <hr/> automatically
    // - the next paragraph after a heading should be a normal paragraph
    // - remove the bottom margin from the last list item before appending
    // - the next checklist item after a checked item should be unchecked
    auto blockFmt = cursor.blockFormat();
    auto charFmt = cursor.charFormat();
    blockFmt.clearProperty(QTextFormat::BlockTrailingHorizontalRulerWidth);
    if (blockFmt.hasProperty(QTextFormat::HeadingLevel)) {
        blockFmt.clearProperty(QTextFormat::HeadingLevel);
        charFmt = QTextCharFormat();
    }
    if (cursor.currentList()) {
        auto existingFmt = cursor.blockFormat();
        existingFmt.clearProperty(QTextBlockFormat::BlockBottomMargin);
        cursor.setBlockFormat(existingFmt);
        if (blockFmt.marker() == QTextBlockFormat::MarkerType::Checked)
            blockFmt.setMarker(QTextBlockFormat::MarkerType::Unchecked);
    }

    // After a blank line, reset block and char formats. I.e. you can end a list,
    // block quote, etc. by hitting enter twice, and get back to normal paragraph style.
    if (cursor.block().text().isEmpty() &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth) &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockCodeLanguage)) {
        blockFmt = QTextBlockFormat();
        const bool blockFmtChanged = (cursor.blockFormat() != blockFmt);
        charFmt = QTextCharFormat();
        cursor.setBlockFormat(blockFmt);
        cursor.setCharFormat(charFmt);
        // If the user hit enter twice just to get back to default format,
        // don't actually insert a new block. But if the user then hits enter
        // yet again, the block format will not change, so we will insert a block.
        // This is what many word processors do.
        if (blockFmtChanged)
            return;
    }

    cursor.insertBlock(blockFmt, charFmt);
}